

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O1

TargetList *
Analyser::Static::PCCompatible::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  pointer psVar1;
  pointer psVar2;
  tuple<Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_> this;
  __uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> local_20
  ;
  
  psVar1 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (psVar1 != psVar2) {
    this.
    super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
    .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
          )operator_new(0x90);
    Target::Target((Target *)
                   this.
                   super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                   .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ::operator=((vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                 *)((long)this.
                          super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                          .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl +
                   0x18),&media->disks);
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ::operator=((vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                 *)((long)this.
                          super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                          .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl +
                   0x30),&media->tapes);
    std::
    vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ::operator=((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                 *)((long)this.
                          super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                          .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl +
                   0x48),&media->cartridges);
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ::operator=((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                 *)((long)this.
                          super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                          .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl +
                   0x60),&media->mass_storage_devices);
    local_20._M_t.
    super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
    .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl =
         (tuple<Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>)
         (tuple<Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>)
         this.
         super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
         .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)&local_20);
    if ((_Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
         )local_20._M_t.
          super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
          .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl != (Target *)0x0) {
      (**(code **)(*(long *)local_20._M_t.
                            super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
                            .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl +
                  8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::PCCompatible::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	// This analyser can comprehend disks only.
	if(media.disks.empty()) return {};

	// No analysis is applied yet.
	Analyser::Static::TargetList targets;

	using Target = Analyser::Static::PCCompatible::Target;
	auto *const target = new Target();
	target->media = media;
	targets.push_back(std::unique_ptr<Analyser::Static::Target>(target));

	return targets;
}